

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O1

void __thiscall SM83::rl_dhl(SM83 *this)

{
  byte bVar1;
  byte bVar2;
  byte value;
  string_view fmt;
  format_args args;
  ulong local_68 [2];
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  
  local_68[0] = (ulong)(this->field_0).af;
  local_58 = (ulong)(this->field_1).bc;
  local_48 = (ulong)(this->field_2).de;
  local_38 = (ulong)(this->field_3).hl;
  local_28 = (ulong)this->sp;
  local_18 = (ulong)this->pc_at_opcode;
  fmt.size_ = 0x45;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  RL (HL)\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_68;
  args.desc_ = 0x222222;
  ::fmt::v11::vprint(fmt,args);
  bVar2 = Bus::Read8(this->bus,(this->field_3).hl,true);
  bVar1 = (this->field_0).field_1.f;
  value = bVar1 >> 4 & 1 | bVar2 * '\x02';
  (this->field_0).field_1.f = (value == 0) << 7 | bVar2 >> 3 & 0x10 | bVar1 & 0xf;
  Bus::Write8(this->bus,(this->field_3).hl,value,true);
  return;
}

Assistant:

void SM83::rl_dhl() {
    LTRACE("RL (HL)");

    u8 value = bus.Read8(hl);
    bool carry = HasFlag(Flags::Carry);

    bool should_carry = value & (1 << 7);
    SetCarryFlag(should_carry);

    u8 result = value << 1;
    result |= carry;

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);

    bus.Write8(hl, result);
}